

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

bool __thiscall soul::heart::ArrayElement::readsVariable(ArrayElement *this,Variable *v)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  undefined8 extraout_RDX;
  
  iVar2 = (*(((this->parent).object)->super_Object)._vptr_Object[4])();
  bVar1 = true;
  if ((char)iVar2 == '\0') {
    if ((this->dynamicIndex).object != (Expression *)0x0) {
      pEVar3 = pool_ptr<soul::heart::Expression>::operator->(&this->dynamicIndex);
      UNRECOVERED_JUMPTABLE = (pEVar3->super_Object)._vptr_Object[4];
      iVar2 = (*UNRECOVERED_JUMPTABLE)(pEVar3,v,extraout_RDX,UNRECOVERED_JUMPTABLE);
      return SUB41(iVar2,0);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool readsVariable (Variable& v) const override    { return parent->readsVariable (v) || (isDynamic() && dynamicIndex->readsVariable (v)); }